

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void parse_label(LexState *ls)

{
  uint8_t *puVar1;
  int iVar2;
  FuncState *pFVar3;
  bool bVar4;
  MSize idx;
  uint uVar5;
  GCstr *name;
  VarInfo *pVVar6;
  
  pFVar3 = ls->fs;
  pFVar3->lasttarget = pFVar3->pc;
  puVar1 = &pFVar3->bl->flags;
  *puVar1 = *puVar1 | 4;
  lj_lex_next(ls);
  name = lex_str(ls);
  pVVar6 = gola_findlabel(ls,name);
  if (pVVar6 != (VarInfo *)0x0) {
    lj_lex_error(ls,0,LJ_ERR_XLDUP,name + 1);
  }
  idx = gola_new(ls,name,'\x04',pFVar3->pc);
  lex_check(ls,0x11d);
  while( true ) {
    iVar2 = ls->tok;
    if (iVar2 != 0x11d) {
      if ((iVar2 - 0x104U < 0x1e) && ((0x20020007U >> (iVar2 - 0x104U & 0x1f) & 1) != 0)) {
        bVar4 = false;
      }
      else {
        bVar4 = true;
      }
      if (iVar2 != 0x115 && !bVar4) {
        ls->vstack[idx].slot = pFVar3->bl->nactvar;
      }
      gola_resolve(ls,pFVar3->bl,idx);
      return;
    }
    uVar5 = ls->level + 1;
    ls->level = uVar5;
    if (199 < uVar5) break;
    parse_label(ls);
    ls->level = ls->level - 1;
  }
  lj_lex_error(ls,0,LJ_ERR_XLEVELS);
}

Assistant:

static void parse_label(LexState *ls)
{
  FuncState *fs = ls->fs;
  GCstr *name;
  MSize idx;
  fs->lasttarget = fs->pc;
  fs->bl->flags |= FSCOPE_GOLA;
  lj_lex_next(ls);  /* Skip '::'. */
  name = lex_str(ls);
  if (gola_findlabel(ls, name))
    lj_lex_error(ls, 0, LJ_ERR_XLDUP, strdata(name));
  idx = gola_new(ls, name, VSTACK_LABEL, fs->pc);
  lex_check(ls, TK_label);
  /* Recursively parse trailing statements: labels and ';' (Lua 5.2 only). */
  for (;;) {
    if (ls->tok == TK_label) {
      synlevel_begin(ls);
      parse_label(ls);
      synlevel_end(ls);
    } else if (LJ_52 && ls->tok == ';') {
      lj_lex_next(ls);
    } else {
      break;
    }
  }
  /* Trailing label is considered to be outside of scope. */
  if (parse_isend(ls->tok) && ls->tok != TK_until)
    ls->vstack[idx].slot = fs->bl->nactvar;
  gola_resolve(ls, fs->bl, idx);
}